

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoordinationNumber.cpp
# Opt level: O0

void __thiscall
OpenMD::GCN::GCN(GCN *this,SimInfo *info,string *filename,string *sele1,string *sele2,RealType rCut,
                int bins)

{
  string *in_RDI;
  int in_stack_00000224;
  RealType in_stack_00000228;
  string *in_stack_00000230;
  string *in_stack_00000238;
  string *in_stack_00000240;
  SimInfo *in_stack_00000248;
  CoordinationNumber *in_stack_00000250;
  string *in_stack_ffffffffffffff38;
  StaticAnalyser *in_stack_ffffffffffffff40;
  StaticAnalyser *this_00;
  undefined1 local_a9 [25];
  allocator<char> *in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  string local_78 [32];
  string local_58 [88];
  
  CoordinationNumber::CoordinationNumber
            (in_stack_00000250,in_stack_00000248,in_stack_00000240,in_stack_00000238,
             in_stack_00000230,in_stack_00000228,in_stack_00000224);
  *(undefined ***)in_RDI = &PTR__GCN_0055f118;
  getPrefix(in_RDI);
  std::operator+(in_RDI,(char *)in_stack_ffffffffffffff40);
  StaticAnalyser::setOutputName(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_78);
  this_00 = (StaticAnalyser *)local_a9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff80,(char *)in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  StaticAnalyser::setAnalysisType(this_00,in_stack_ffffffffffffff38);
  std::__cxx11::string::~string((string *)(local_a9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_a9);
  return;
}

Assistant:

GCN::GCN(SimInfo* info, const std::string& filename, const std::string& sele1,
           const std::string& sele2, RealType rCut, int bins) :
      CoordinationNumber(info, filename, sele1, sele2, rCut, bins) {
    setOutputName(getPrefix(filename) + ".gcn");
    setAnalysisType("Generalized Coordination Number");
  }